

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

QSize __thiscall QHeaderView::sectionSizeFromContents(QHeaderView *this,int logicalIndex)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QIcon QVar4;
  qsizetype qVar5;
  QMetaTypeInterface *pQVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  InterfaceType *pIVar9;
  char16_t *pcVar10;
  bool bVar11;
  char cVar12;
  QMetaType QVar13;
  anon_union_24_3_e3d07ef4_for_data *paVar14;
  QStyle *pQVar15;
  QSize QVar16;
  long in_FS_OFFSET;
  QIcon t_1;
  QSize t;
  QIcon moved;
  QIcon local_160;
  QIcon local_158;
  char16_t *pcStack_150;
  qsizetype local_148;
  QMetaTypeInterface *local_138;
  undefined1 *puStack_130;
  undefined1 local_120 [64];
  int local_e0;
  InterfaceType *local_d8;
  char16_t *pcStack_d0;
  qsizetype qStack_c8;
  QIcon local_b8 [2];
  SortIndicator local_a4;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  uint uStack_60;
  undefined4 uStack_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  uint uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QWidget::ensurePolished((QWidget *)this);
  paVar14 = &local_58;
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_4_ = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58._0_4_ = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  (**(code **)(**(long **)(lVar3 + 0x2f8) + 0xa0))
            (paVar14,*(long **)(lVar3 + 0x2f8),logicalIndex,*(undefined4 *)(lVar3 + 0x548),0xd);
  if (CONCAT44(uStack_3c,uStack_40) < 4) {
    memset((QStyleOptionHeaderV2 *)local_120,0xaa,0x88);
    QStyleOptionHeaderV2::QStyleOptionHeaderV2((QStyleOptionHeaderV2 *)local_120);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x318))(this,(QStyleOptionHeaderV2 *)local_120);
    paVar14 = &local_78;
    local_78._16_4_ = 0xaaaaaaaa;
    local_78._20_4_ = 0xaaaaaaaa;
    uStack_60 = 0xaaaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._8_4_ = 0xaaaaaaaa;
    local_78._12_4_ = 0xaaaaaaaa;
    local_e0 = logicalIndex;
    (**(code **)(**(long **)(lVar3 + 0x2f8) + 0xa0))
              (paVar14,*(long **)(lVar3 + 0x2f8),logicalIndex,*(undefined4 *)(lVar3 + 0x548),6);
    local_138 = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
    QFont::QFont((QFont *)&local_138);
    if ((CONCAT44(uStack_5c,uStack_60) < 4) ||
       (cVar12 = QMetaType::canConvert
                           ((QMetaTypeInterface *)
                            (CONCAT44(uStack_5c,uStack_60) & 0xfffffffffffffffc),(QMetaType)0x7f5e90
                           ), cVar12 == '\0')) {
      QFont::operator=((QFont *)&local_138,
                       &((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget.data)->fnt);
    }
    else {
      local_158.d = (QIconPrivate *)&QtPrivate::QMetaTypeInterfaceWrapper<QFont>::metaType;
      local_98.shared = (PrivateShared *)(CONCAT44(uStack_5c,uStack_60) & 0xfffffffffffffffc);
      bVar11 = comparesEqual((QMetaType *)&local_98.shared,(QMetaType *)&local_158);
      if (bVar11) {
        if ((uStack_60 & 1) == 0) {
          paVar14 = &local_78;
        }
        else {
          paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_78.shared + (int)*(uint *)(local_78.shared + 4));
        }
        QFont::QFont((QFont *)local_98.data,(QFont *)paVar14->data);
      }
      else {
        local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QFont::QFont((QFont *)local_98.data);
        QVar13.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((uStack_60 & 1) != 0) {
          paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_78.shared + (int)*(uint *)(local_78.shared + 4));
        }
        QMetaType::convert(QVar13,paVar14,(QMetaType)local_158.d,&local_98);
      }
      pQVar6 = local_138;
      local_138 = (QMetaTypeInterface *)local_98.shared;
      local_98.shared = (PrivateShared *)pQVar6;
      uVar7 = puStack_130._0_4_;
      puStack_130 = (undefined1 *)CONCAT44(puStack_130._4_4_,local_98._8_4_);
      local_98._8_4_ = uVar7;
      QFont::~QFont((QFont *)local_98.data);
    }
    QFont::setWeight((Weight)(QFont *)&local_138);
    QFontMetrics::QFontMetrics((QFontMetrics *)local_98.data,(QFont *)&local_138);
    uVar8 = local_120._32_8_;
    local_120._32_8_ = local_98.shared;
    local_98.shared = (PrivateShared *)uVar8;
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_98.data);
    (**(code **)(**(long **)(lVar3 + 0x2f8) + 0xa0))
              (&local_98,*(long **)(lVar3 + 0x2f8),logicalIndex,*(undefined4 *)(lVar3 + 0x548),0);
    ::QVariant::toString();
    pcVar10 = pcStack_d0;
    pIVar9 = local_d8;
    qVar5 = local_148;
    QVar4.d = local_158.d;
    local_158.d = (QIconPrivate *)local_d8;
    local_d8 = (InterfaceType *)QVar4.d;
    pcStack_d0 = pcStack_150;
    pcStack_150 = pcVar10;
    local_148 = qStack_c8;
    qStack_c8 = qVar5;
    if (pIVar9 != (InterfaceType *)0x0) {
      LOCK();
      *(int *)pIVar9 = *(int *)pIVar9 + -1;
      iVar1._0_2_ = pIVar9->revision;
      iVar1._2_2_ = pIVar9->alignment;
      UNLOCK();
      if (iVar1 == 0) {
        QArrayData::deallocate((QArrayData *)pIVar9,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_98);
    (**(code **)(**(long **)(lVar3 + 0x2f8) + 0xa0))
              (&local_98,*(long **)(lVar3 + 0x2f8),logicalIndex,*(undefined4 *)(lVar3 + 0x548),1);
    paVar14 = &local_58;
    ::QVariant::operator=((QVariant *)paVar14,(QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_98);
    local_98.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
    local_158.d = (QIconPrivate *)(CONCAT44(uStack_3c,uStack_40) & 0xfffffffffffffffc);
    bVar11 = comparesEqual((QMetaType *)&local_158,(QMetaType *)&local_98.shared);
    if (bVar11) {
      if ((uStack_40 & 1) == 0) {
        paVar14 = &local_58;
      }
      else {
        paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                  ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                  CONCAT44(local_58._4_4_,local_58._0_4_));
      }
      QIcon::QIcon(&local_158,(QIcon *)&paVar14->shared);
    }
    else {
      local_158.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QIcon::QIcon(&local_158);
      QVar13.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((uStack_40 & 1) != 0) {
        paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                  ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                  CONCAT44(local_58._4_4_,local_58._0_4_));
      }
      QMetaType::convert(QVar13,paVar14,(QMetaType)local_98.shared,&local_158);
    }
    local_98.shared = (PrivateShared *)local_b8[0].d;
    local_b8[0].d = local_158.d;
    local_158.d = (QIconPrivate *)0x0;
    QIcon::~QIcon((QIcon *)&local_98.shared);
    QIcon::~QIcon(&local_158);
    cVar12 = QIcon::isNull();
    if (cVar12 != '\0') {
      local_158.d = (QIconPrivate *)&QtPrivate::QMetaTypeInterfaceWrapper<QPixmap>::metaType;
      local_98.shared = (PrivateShared *)(CONCAT44(uStack_3c,uStack_40) & 0xfffffffffffffffc);
      bVar11 = comparesEqual((QMetaType *)&local_98.shared,(QMetaType *)&local_158);
      if (bVar11) {
        if ((uStack_40 & 1) == 0) {
          paVar14 = &local_58;
        }
        else {
          paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                    ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                    CONCAT44(local_58._4_4_,local_58._0_4_));
        }
        QPixmap::QPixmap((QPixmap *)local_98.data,(QPixmap *)paVar14->data);
      }
      else {
        local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QPixmap::QPixmap((QPixmap *)local_98.data);
        paVar14 = &local_58;
        QVar13.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((uStack_40 & 1) != 0) {
          paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                    ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                    CONCAT44(local_58._4_4_,local_58._0_4_));
        }
        QMetaType::convert(QVar13,paVar14,(QMetaType)local_158.d,&local_98);
      }
      QIcon::QIcon(&local_160,(QPixmap *)local_98.data);
      local_158.d = local_b8[0].d;
      local_b8[0].d = local_160.d;
      local_160.d = (QIconPrivate *)0x0;
      QIcon::~QIcon(&local_158);
      QIcon::~QIcon(&local_160);
      QPixmap::~QPixmap((QPixmap *)local_98.data);
    }
    if (*(char *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                            super_QWidget.field_0x8 + 0x554) == '\x01') {
      local_a4 = SortDown;
    }
    pQVar15 = QWidget::style((QWidget *)this);
    local_98._forAlignment = -NAN;
    QVar16 = (QSize)(**(code **)(*(long *)pQVar15 + 0xe8))(pQVar15,0x13,local_120,&local_98,this);
    QFont::~QFont((QFont *)&local_138);
    ::QVariant::~QVariant((QVariant *)&local_78);
    QIcon::~QIcon(local_b8);
    if (local_d8 != (InterfaceType *)0x0) {
      LOCK();
      *(int *)local_d8 = *(int *)local_d8 + -1;
      iVar2._0_2_ = local_d8->revision;
      iVar2._2_2_ = local_d8->alignment;
      UNLOCK();
      if (iVar2 == 0) {
        QArrayData::deallocate((QArrayData *)local_d8,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_120);
  }
  else {
    local_78.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QSize>::metaType;
    local_120._0_8_ = CONCAT44(uStack_3c,uStack_40) & 0xfffffffffffffffc;
    bVar11 = comparesEqual((QMetaType *)local_120,(QMetaType *)&local_78.shared);
    if (bVar11) {
      if ((uStack_40 & 1) == 0) {
        paVar14 = &local_58;
      }
      else {
        paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                  ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                  CONCAT44(local_58._4_4_,local_58._0_4_));
      }
      local_120._0_8_ = paVar14->shared;
      QVar16 = (QSize)local_120._0_8_;
    }
    else {
      local_120._0_4_ = -1;
      local_120._4_4_ = -1;
      QVar13.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((uStack_40 & 1) != 0) {
        paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                  ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                  CONCAT44(local_58._4_4_,local_58._0_4_));
      }
      QMetaType::convert(QVar13,paVar14,(QMetaType)local_78.shared,local_120);
      QVar16 = (QSize)local_120._0_8_;
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar16;
}

Assistant:

QSize QHeaderView::sectionSizeFromContents(int logicalIndex) const
{
    Q_D(const QHeaderView);
    Q_ASSERT(logicalIndex >= 0);

    ensurePolished();

    // use SizeHintRole
    QVariant variant = d->model->headerData(logicalIndex, d->orientation, Qt::SizeHintRole);
    if (variant.isValid())
        return qvariant_cast<QSize>(variant);

    // otherwise use the contents
    QStyleOptionHeaderV2 opt;
    initStyleOption(&opt);
    opt.section = logicalIndex;
    QVariant var = d->model->headerData(logicalIndex, d->orientation,
                                            Qt::FontRole);
    QFont fnt;
    if (var.isValid() && var.canConvert<QFont>())
        fnt = qvariant_cast<QFont>(var);
    else
        fnt = font();
    fnt.setBold(true);
    opt.fontMetrics = QFontMetrics(fnt);
    opt.text = d->model->headerData(logicalIndex, d->orientation,
                                    Qt::DisplayRole).toString();
    variant = d->model->headerData(logicalIndex, d->orientation, Qt::DecorationRole);
    opt.icon = qvariant_cast<QIcon>(variant);
    if (opt.icon.isNull())
        opt.icon = qvariant_cast<QPixmap>(variant);
    if (isSortIndicatorShown())
        opt.sortIndicator = QStyleOptionHeader::SortDown;
    return style()->sizeFromContents(QStyle::CT_HeaderSection, &opt, QSize(), this);
}